

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

bool leveldb::CompareIterators(int step,DB *model,DB *db,Snapshot *model_snap,Snapshot *db_snap)

{
  FILE *pFVar1;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  bool bVar4;
  char cVar5;
  char cVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  undefined4 extraout_var;
  long *plVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 local_d0 [16];
  string local_c0;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  string local_80;
  undefined1 local_60 [16];
  char local_50 [16];
  undefined2 local_40 [4];
  Snapshot *local_38;
  long *plVar10;
  undefined4 extraout_var_00;
  
  local_40[0] = 0x100;
  local_38 = model_snap;
  iVar9 = (*model->_vptr_DB[6])(model,local_40);
  plVar10 = (long *)CONCAT44(extraout_var,iVar9);
  local_38 = db_snap;
  iVar9 = (*db->_vptr_DB[6])(db,local_40);
  plVar11 = (long *)CONCAT44(extraout_var_00,iVar9);
  (**(code **)(*plVar10 + 0x18))(plVar10);
  (**(code **)(*plVar11 + 0x18))(plVar11);
  bVar4 = true;
  uVar15 = 0;
  do {
    cVar5 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (cVar5 == '\0') break;
    cVar5 = (**(code **)(*plVar11 + 0x10))(plVar11);
    if (cVar5 == '\0') break;
    uVar15 = uVar15 + 1;
    auVar16 = (**(code **)(*plVar10 + 0x40))(plVar10);
    uVar12 = auVar16._8_8_;
    auVar17 = (**(code **)(*plVar11 + 0x40))(plVar11);
    uVar13 = auVar17._8_8_;
    uVar14 = uVar13;
    if (uVar12 < uVar13) {
      uVar14 = uVar12;
    }
    iVar9 = bcmp(auVar16._0_8_,auVar17._0_8_,uVar14);
    pFVar1 = _stderr;
    if ((iVar9 != 0) || (uVar12 != uVar13)) {
      local_60 = (**(code **)(*plVar10 + 0x40))(plVar10);
      EscapeString_abi_cxx11_(&local_c0,(leveldb *)local_60,local_60._8_8_);
      _Var2._M_p = local_c0._M_dataplus._M_p;
      auVar16 = (**(code **)(*plVar11 + 0x40))(plVar11);
      local_d0 = auVar16;
      EscapeString_abi_cxx11_(&local_80,(leveldb *)local_d0,auVar16._8_8_);
      fprintf(pFVar1,"step %d: Key mismatch: \'%s\' vs. \'%s\'\n",(ulong)(uint)step,_Var2._M_p,
              local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      bVar4 = false;
      break;
    }
    auVar16 = (**(code **)(*plVar10 + 0x48))(plVar10);
    uVar12 = auVar16._8_8_;
    auVar17 = (**(code **)(*plVar11 + 0x48))(plVar11);
    uVar13 = auVar17._8_8_;
    uVar14 = uVar13;
    if (uVar12 < uVar13) {
      uVar14 = uVar12;
    }
    iVar9 = bcmp(auVar16._0_8_,auVar17._0_8_,uVar14);
    pFVar1 = _stderr;
    if ((iVar9 != 0) || (uVar12 != uVar13)) {
      auVar16 = (**(code **)(*plVar10 + 0x40))(plVar10);
      local_d0 = auVar16;
      EscapeString_abi_cxx11_(&local_c0,(leveldb *)local_d0,auVar16._8_8_);
      _Var2._M_p = local_c0._M_dataplus._M_p;
      auVar16 = (**(code **)(*plVar10 + 0x48))(plVar10);
      local_90 = auVar16;
      EscapeString_abi_cxx11_(&local_80,(leveldb *)local_90,auVar16._8_8_);
      _Var3._M_p = local_80._M_dataplus._M_p;
      auVar16 = (**(code **)(*plVar10 + 0x48))(plVar10);
      local_a0 = auVar16;
      EscapeString_abi_cxx11_((string *)local_60,(leveldb *)local_a0,auVar16._8_8_);
      fprintf(pFVar1,"step %d: Value mismatch for key \'%s\': \'%s\' vs. \'%s\'\n",(ulong)(uint)step
              ,_Var2._M_p,_Var3._M_p,local_60._0_8_);
      if ((char *)local_60._0_8_ != local_50) {
        operator_delete((void *)local_60._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      bVar4 = false;
    }
    (**(code **)(*plVar10 + 0x30))(plVar10);
    (**(code **)(*plVar11 + 0x30))(plVar11);
  } while (bVar4);
  if (bVar4 != false) {
    cVar5 = (**(code **)(*plVar10 + 0x10))(plVar10);
    cVar6 = (**(code **)(*plVar11 + 0x10))(plVar11);
    pFVar1 = _stderr;
    if (cVar5 != cVar6) {
      bVar7 = (**(code **)(*plVar10 + 0x10))(plVar10);
      bVar8 = (**(code **)(*plVar11 + 0x10))(plVar11);
      bVar4 = false;
      fprintf(pFVar1,"step %d: Mismatch at end of iterators: %d vs. %d\n",(ulong)(uint)step,
              (ulong)bVar7,(ulong)bVar8);
    }
  }
  fprintf(_stderr,"%d entries compared: ok=%d\n",(ulong)uVar15,(ulong)bVar4);
  (**(code **)(*plVar10 + 8))(plVar10);
  (**(code **)(*plVar11 + 8))(plVar11);
  return bVar4;
}

Assistant:

static bool CompareIterators(int step, DB* model, DB* db,
                             const Snapshot* model_snap,
                             const Snapshot* db_snap) {
  ReadOptions options;
  options.snapshot = model_snap;
  Iterator* miter = model->NewIterator(options);
  options.snapshot = db_snap;
  Iterator* dbiter = db->NewIterator(options);
  bool ok = true;
  int count = 0;
  for (miter->SeekToFirst(), dbiter->SeekToFirst();
       ok && miter->Valid() && dbiter->Valid(); miter->Next(), dbiter->Next()) {
    count++;
    if (miter->key().compare(dbiter->key()) != 0) {
      std::fprintf(stderr, "step %d: Key mismatch: '%s' vs. '%s'\n", step,
                   EscapeString(miter->key()).c_str(),
                   EscapeString(dbiter->key()).c_str());
      ok = false;
      break;
    }

    if (miter->value().compare(dbiter->value()) != 0) {
      std::fprintf(stderr,
                   "step %d: Value mismatch for key '%s': '%s' vs. '%s'\n",
                   step, EscapeString(miter->key()).c_str(),
                   EscapeString(miter->value()).c_str(),
                   EscapeString(miter->value()).c_str());
      ok = false;
    }
  }

  if (ok) {
    if (miter->Valid() != dbiter->Valid()) {
      std::fprintf(stderr, "step %d: Mismatch at end of iterators: %d vs. %d\n",
                   step, miter->Valid(), dbiter->Valid());
      ok = false;
    }
  }
  std::fprintf(stderr, "%d entries compared: ok=%d\n", count, ok);
  delete miter;
  delete dbiter;
  return ok;
}